

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.cpp
# Opt level: O1

ostream * arangodb::velocypack::operator<<(ostream *stream,Slice *slice)

{
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  char *in_R8;
  string_view header;
  string local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"[Slice ",7);
  __s = valueTypeName(SliceStaticData::TypeMap[*slice->_start]);
  if (__s == (char *)0x0) {
    std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(stream,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream," (",2);
  header._M_str = in_R8;
  header._M_len = (size_t)"0x";
  HexDump::toHex_abi_cxx11_(&local_38,(HexDump *)(ulong)*slice->_start,'\x02',header);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"), byteSize: ",0xd);
  if ("\x01\x01"[*slice->_start] == '\0') {
    SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSizeDynamic
              ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)slice,
               slice->_start);
  }
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, Slice const* slice) {
  stream << "[Slice " << valueTypeName(slice->type()) << " ("
         << slice->hexType() << "), byteSize: " << slice->byteSize() << "]";
  return stream;
}